

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_color_hsva_b(nk_byte *h,nk_byte *s,nk_byte *v,nk_byte *a,nk_color in)

{
  int tmp [4];
  nk_byte local_38 [4];
  nk_byte local_34 [4];
  nk_byte local_30 [4];
  nk_byte local_2c [4];
  
  nk_color_hsva_i((int *)local_38,(int *)local_34,(int *)local_30,(int *)local_2c,in);
  *h = local_38[0];
  *s = local_34[0];
  *v = local_30[0];
  *a = local_2c[0];
  return;
}

Assistant:

NK_API void
nk_color_hsva_b(nk_byte *h, nk_byte *s, nk_byte *v, nk_byte *a, struct nk_color in)
{
    int tmp[4];
    nk_color_hsva_i(&tmp[0], &tmp[1], &tmp[2], &tmp[3], in);
    *h = (nk_byte)tmp[0];
    *s = (nk_byte)tmp[1];
    *v = (nk_byte)tmp[2];
    *a = (nk_byte)tmp[3];
}